

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_types.h
# Opt level: O0

void __thiscall
Clasp::SingleOwnerPtr<Clasp::Asp::LpStats,_Clasp::DeleteObject>::reset
          (SingleOwnerPtr<Clasp::Asp::LpStats,_Clasp::DeleteObject> *this,LpStats *x)

{
  bool bVar1;
  LpStats *pLVar2;
  unsigned_long uVar3;
  LpStats *in_RSI;
  LpStats *in_RDI;
  DeleteObject deleter;
  
  pLVar2 = get((SingleOwnerPtr<Clasp::Asp::LpStats,_Clasp::DeleteObject> *)0x131256);
  if ((in_RSI != pLVar2) &&
     (bVar1 = is_owner((SingleOwnerPtr<Clasp::Asp::LpStats,_Clasp::DeleteObject> *)0x13126c), bVar1)
     ) {
    release((SingleOwnerPtr<Clasp::Asp::LpStats,_Clasp::DeleteObject> *)in_RSI);
    DeleteObject::operator()((DeleteObject *)in_RSI,in_RDI);
  }
  uVar3 = set_bit<unsigned_long>((unsigned_long)in_RSI,(uint)((ulong)in_RDI >> 0x20));
  *(unsigned_long *)in_RDI->rules[0].key = uVar3;
  return;
}

Assistant:

void reset(T* x)             {
		if (x != get() && is_owner()) { D deleter; deleter(release()); }
		ptr_ = set_bit(uintp(x),0);
	}